

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void act_new(char *format,CHAR_DATA *ch,void *arg1,void *arg2,int type,int min_pos)

{
  char *args;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  ROOM_INDEX_DATA *pRVar7;
  ulong uVar8;
  char cVar9;
  char cVar10;
  char **ppcVar11;
  char *pcVar12;
  CHAR_DATA *ch_00;
  size_t sVar13;
  CHAR_DATA *ch_01;
  char *pcVar14;
  char *pcVar15;
  string_view fmt;
  string_view fmt_00;
  char buf2 [100];
  char buf [4608];
  char fname [4608];
  char *local_24c0;
  ulong local_24b8;
  CLogger *local_24b0;
  char local_24a8 [112];
  char local_2438;
  char acStack_2437 [3];
  undefined4 local_2434;
  char local_1238 [4616];
  
  if (format == (char *)0x0) {
    return;
  }
  if (ch == (CHAR_DATA *)0x0) {
    return;
  }
  if (*format == '\0') {
    return;
  }
  pRVar7 = ch->in_room;
  if (pRVar7 == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  local_24c0 = format;
  if (type == 2) {
    if (arg2 == (void *)0x0) {
      fmt_00._M_str = "Act: null vch with TO_VICT. -- {}";
      fmt_00._M_len = 0x21;
      CLogger::Warn<char_const*&>((CLogger *)&RS.field_0x140,fmt_00,&local_24c0);
      return;
    }
    pRVar7 = *(ROOM_INDEX_DATA **)((long)arg2 + 0xa8);
    if (pRVar7 == (ROOM_INDEX_DATA *)0x0) {
      return;
    }
  }
  ch_00 = pRVar7->people;
  if (ch_00 != (CHAR_DATA *)0x0) {
    local_24b8 = (ulong)(type - 1);
    local_24b0 = (CLogger *)&RS.field_0x140;
    do {
      bVar5 = is_npc(ch_00);
      if ((((bVar5) || (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) && (min_pos <= ch_00->position)) &&
         ((type != 3 || (ch_00 == ch)))) {
        if ((type != 0 || ch_00 != ch) && (type != 2 || ch_00 == (CHAR_DATA *)arg2 && ch_00 != ch))
        {
          if ((uint)local_24b8 < 7) {
            switch((long)&switchD_0027f930::switchdataD_003953a0 +
                   (long)(int)(&switchD_0027f930::switchdataD_003953a0)[local_24b8]) {
            case 0x27f932:
              if (ch_00 == (CHAR_DATA *)arg2 || ch_00 == ch) goto LAB_0027f8da;
              if (type != 7) {
                if (type == 6) goto switchD_0027f930_caseD_27f99b;
                if (type == 5) goto switchD_0027f930_caseD_27f95d;
                goto switchD_0027f930_caseD_27f9e6;
              }
              break;
            case 0x27f95d:
switchD_0027f930_caseD_27f95d:
              bVar5 = is_immortal(ch_00);
              if (((ch_00 == ch) || (!bVar5)) || (bVar5 = can_see(ch_00,ch), !bVar5))
              goto LAB_0027f8da;
              if (type != 7) {
                if (type == 6) goto switchD_0027f930_caseD_27f99b;
                goto switchD_0027f930_caseD_27f9e6;
              }
              break;
            case 0x27f99b:
switchD_0027f930_caseD_27f99b:
              bVar5 = is_same_group(ch_00,ch);
              if (!bVar5) goto LAB_0027f8da;
              if (type != 7) goto switchD_0027f930_caseD_27f9e6;
              break;
            case 0x27f9e6:
              goto switchD_0027f930_caseD_27f9e6;
            }
            bVar5 = is_same_group(ch_00,ch);
            if ((!bVar5) && ((type & 0xfffffffeU) != 6 || ch_00 != ch)) {
LAB_0027f9f8:
              pcVar14 = &local_2438;
              pcVar15 = local_24c0;
LAB_0027fa0a:
              while (cVar10 = *pcVar15, cVar10 == '$') {
                args = pcVar15 + 1;
                if ((arg2 == (void *)0x0) && (*args != 'I' && 0xe5 < (byte)(*args + 0xa5U))) {
                  sVar13 = 0x1e;
                  pcVar12 = "Act: missing arg2 for code {}.";
LAB_0027fadb:
                  fmt._M_str = pcVar12;
                  fmt._M_len = sVar13;
                  CLogger::Warn<char_const&>(local_24b0,fmt,args);
                  pcVar12 = " <@@@> ";
                  goto switchD_0027fa69_caseD_74;
                }
                pcVar12 = (char *)arg1;
                switch(*args) {
                case 'd':
                  pcVar12 = "door";
                  if ((arg2 != (void *)0x0) && (pcVar12 = "door", *arg2 != '\0')) {
                    pcVar12 = local_1238;
                    one_argument((char *)arg2,pcVar12);
                  }
                  break;
                case 'e':
                  uVar1 = ch->sex;
LAB_0027fbdc:
                  if (1 < (short)uVar1) {
                    uVar1 = 2;
                  }
                  if ((short)uVar1 < 1) {
                    uVar1 = 0;
                  }
                  uVar8 = (ulong)uVar1;
                  ppcVar11 = act_area::he_she;
                  goto LAB_0027fcd1;
                case 'f':
                  pcVar12 = ch->true_name;
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = ch->name;
                  }
                  break;
                case 'g':
                case 'h':
                case 'j':
                case 'k':
                case 'l':
                case 'o':
                case 'q':
                case 'r':
switchD_0027fa69_caseD_67:
                  sVar13 = 0x11;
                  pcVar12 = "Act: bad code {}.";
                  goto LAB_0027fadb;
                case 'i':
                  uVar4 = *arg1;
LAB_0027fcd9:
                  pcVar12 = local_24a8;
                  sprintf(pcVar12,"%d",(ulong)uVar4);
                  break;
                case 'm':
                  uVar2 = ch->sex;
LAB_0027fc87:
                  if (1 < (short)uVar2) {
                    uVar2 = 2;
                  }
                  if ((short)uVar2 < 1) {
                    uVar2 = 0;
                  }
                  uVar8 = (ulong)uVar2;
                  ppcVar11 = act_area::him_her;
                  goto LAB_0027fcd1;
                case 'n':
                  ch_01 = ch;
LAB_0027fcf4:
                  pcVar12 = get_descr_form(ch_01,ch_00,false);
                  break;
                case 'p':
                  pcVar12 = "something";
                  if (arg1 != (void *)0x0) {
                    bVar5 = can_see_obj(ch_00,(OBJ_DATA *)arg1);
                    pcVar12 = "something";
                    if (bVar5) {
                      pcVar12 = *(char **)((long)arg1 + 0x88);
                    }
                    if ((((3 < (long)args - (long)local_24c0) && (pcVar15[-3] == '\'')) &&
                        (pcVar15[-2] == 's')) ||
                       (((5 < (long)args - (long)local_24c0 && (pcVar15[-4] == 'o')) &&
                        ((pcVar15[-3] == 'u' && (pcVar15[-2] == 'r')))))) {
                      bVar5 = str_prefix("the ",pcVar12);
                      bVar6 = str_prefix("a ",pcVar12 + (ulong)!bVar5 * 4);
                      pcVar12 = pcVar12 + (ulong)!bVar5 * 4 + (ulong)!bVar6 * 2;
                    }
                  }
                  break;
                case 's':
                  uVar3 = ch->sex;
LAB_0027fcb0:
                  if (1 < (short)uVar3) {
                    uVar3 = 2;
                  }
                  if ((short)uVar3 < 1) {
                    uVar3 = 0;
                  }
                  uVar8 = (ulong)uVar3;
                  ppcVar11 = act_area::his_her;
LAB_0027fcd1:
                  pcVar12 = ppcVar11[uVar8];
                  break;
                case 't':
                  break;
                default:
                  switch(*args) {
                  case 'E':
                    uVar1 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                    goto LAB_0027fbdc;
                  case 'F':
                    pcVar12 = *(char **)((long)arg2 + 0xf0);
                    if (pcVar12 == (char *)0x0) {
                      pcVar12 = *(char **)((long)arg2 + 0xe8);
                    }
                    break;
                  default:
                    goto switchD_0027fa69_caseD_67;
                  case 'I':
                    uVar4 = *arg2;
                    goto LAB_0027fcd9;
                  case 'M':
                    uVar2 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                    goto LAB_0027fc87;
                  case 'N':
                    ch_01 = (CHAR_DATA *)arg2;
                    goto LAB_0027fcf4;
                  case 'P':
                    bVar5 = can_see_obj(ch_00,(OBJ_DATA *)arg2);
                    pcVar12 = "something";
                    if (bVar5) {
                      pcVar12 = *(char **)((long)arg2 + 0x88);
                    }
                    break;
                  case 'S':
                    uVar3 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                    goto LAB_0027fcb0;
                  case 'T':
                    pcVar12 = (char *)arg2;
                  }
                }
switchD_0027fa69_caseD_74:
                pcVar15 = pcVar15 + 2;
                cVar10 = *pcVar12;
                *pcVar14 = cVar10;
                while (cVar10 != '\0') {
                  pcVar12 = pcVar12 + 1;
                  cVar10 = *pcVar12;
                  pcVar14[1] = cVar10;
                  pcVar14 = pcVar14 + 1;
                }
              }
              if (cVar10 != '\0') {
                pcVar15 = pcVar15 + 1;
                *pcVar14 = cVar10;
                pcVar14 = pcVar14 + 1;
                goto LAB_0027fa0a;
              }
              pcVar14[0] = '\n';
              pcVar14[1] = '\r';
              pcVar14[2] = '\0';
              bVar5 = str_prefix("\x1b[0m",&local_2438);
              if (bVar5) {
                bVar5 = str_prefix("\x1b",&local_2438);
                if (bVar5) {
                  cVar10 = (char)_local_2438;
                  cVar9 = cVar10 + -0x20;
                  if (0x19 < (byte)(cVar10 + 0x9fU)) {
                    cVar9 = cVar10;
                  }
                  _local_2438 = CONCAT31(acStack_2437,cVar9);
                }
                else {
                  cVar10 = local_2434._3_1_ + -0x20;
                  if (0x19 < (byte)(local_2434._3_1_ + 0x9fU)) {
                    cVar10 = local_2434._3_1_;
                  }
                  local_2434 = CONCAT13(cVar10,(undefined3)local_2434);
                }
              }
              else {
                cVar10 = (char)local_2434;
                cVar9 = cVar10 + -0x20;
                if (0x19 < (byte)(cVar10 + 0x9fU)) {
                  cVar9 = cVar10;
                }
                local_2434 = CONCAT31(local_2434._1_3_,cVar9);
              }
              if (ch_00->desc != (DESCRIPTOR_DATA *)0x0) {
                write_to_buffer(ch_00->desc,&local_2438,((int)pcVar14 + 2) - (int)&local_2438);
              }
            }
          }
          else {
switchD_0027f930_caseD_27f9e6:
            if (((type & 0xfffffffeU) != 6) || (ch_00 != ch)) goto LAB_0027f9f8;
          }
        }
      }
LAB_0027f8da:
      ch_00 = ch_00->next_in_room;
    } while (ch_00 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void act_new(const char *format, CHAR_DATA *ch, const void *arg1, const void *arg2, int type, int min_pos)
{
	static char *const he_she[] = {"it", "he", "she"};
	static char *const him_her[] = {"it", "him", "her"};
	static char *const his_her[] = {"its", "his", "her"};

	char buf[MAX_STRING_LENGTH], buf2[100];
	char fname[MAX_INPUT_LENGTH];
	CHAR_DATA *to;
	CHAR_DATA *vch = (CHAR_DATA *)arg2;
	OBJ_DATA *obj1 = (OBJ_DATA *)arg1;
	OBJ_DATA *obj2 = (OBJ_DATA *)arg2;
	const char *str;
	const char *i;
	char *point;

	/*
	 * Discard null and zero-length messages.
	 */
	if (format == nullptr || format[0] == '\0')
		return;

	/* discard null rooms and chars */
	if (ch == nullptr || ch->in_room == nullptr)
		return;

	/*colorconv(format, format, ch);*/
	to = ch->in_room->people;

	if (type == TO_VICT)
	{
		if (vch == nullptr)
		{
			RS.Logger.Warn("Act: null vch with TO_VICT. -- {}", format);
			return;
		}

		if (vch->in_room == nullptr)
			return;

		to = vch->in_room->people;
	}

	for (; to != nullptr; to = to->next_in_room)
	{
		if ((!is_npc(to) && to->desc == nullptr) || to->position < min_pos)
			continue;

		if ((type == TO_CHAR) && to != ch)
			continue;

		if (type == TO_VICT && (to != vch || to == ch))
			continue;

		if (type == TO_ROOM && to == ch)
			continue;

		if (type == TO_NOTVICT && (to == ch || to == vch))
			continue;

		if (type == TO_IMMINROOM && (!(is_immortal(to)) || (to == ch) || !(can_see(to, ch))))
			continue;

		if (type == TO_GROUP && !is_same_group(to, ch))
			continue;

		if (type == TO_NOTGROUP && is_same_group(to, ch))
			continue;

		if ((type == TO_GROUP || type == TO_NOTGROUP) && to == ch)
			continue;

		point = buf;
		str = format;

		while (*str != '\0')
		{
			if (*str != '$')
			{
				*point++ = *str++;
				continue;
			}

			++str;

			if (arg2 == nullptr && *str >= 'A' && *str <= 'Z' && *str != 'I')
			{
				RS.Logger.Warn("Act: missing arg2 for code {}.", *str);
				i = " <@@@> ";
			}
			else
			{
				switch (*str)
				{
					/* Thx alex for 't' idea */
					case 't':
						i = (char *)arg1;
						break;
					case 'T':
						i = (char *)arg2;
						break;
					case 'n':
						i = get_descr_form(ch, to, false);
						break;
					case 'N':
						i = get_descr_form(vch, to, false);
						break;
					case 'f':
						i = (ch->true_name ? ch->true_name : ch->name);
						break;
					case 'F':
						i = (vch->true_name ? vch->true_name : vch->name);
						break;
					case 'i':
						sprintf(buf2, "%d", *((int *)arg1));
						i = (const char *)&buf2;
						break;
					case 'I':
						sprintf(buf2, "%d", *((int *)arg2));
						i = (const char *)&buf2;
						break;
					case 'e':
						i = he_she[URANGE(0, ch->sex, 2)];
						break;
					case 'E':
						i = he_she[URANGE(0, vch->sex, 2)];
						break;
					case 'm':
						i = him_her[URANGE(0, ch->sex, 2)];
						break;
					case 'M':
						i = him_her[URANGE(0, vch->sex, 2)];
						break;
					case 's':
						i = his_her[URANGE(0, ch->sex, 2)];
						break;
					case 'S':
						i = his_her[URANGE(0, vch->sex, 2)];
						break;
					case 'p':
						if (obj1 == nullptr)
						{
							i = "something";
							break;
						}

						i = can_see_obj(to, obj1) ? obj1->short_descr : "something";

						// obj article truncation: back up 2-don't truncate the/a from obj short descr unless it's preceded
						// by Your or 's
						if (((str - format) >= 4 && *(str - 4) == '\'' && *(str - 3) == 's')
							|| ((str - format) >= 6 && *(str - 5) == 'o' && *(str - 4) == 'u' && *(str - 3) == 'r'))
						{
							if (!str_prefix("the ", i))
								i += 4;

							if (!str_prefix("a ", i))
								i += 2;
						}

						break;
					case 'P':
						i = can_see_obj(to, obj2) ? obj2->short_descr : "something";
						break;
					case 'd':
						if (arg2 == nullptr || ((char *)arg2)[0] == '\0')
						{
							i = "door";
						}
						else
						{
							one_argument((char *)arg2, fname);
							i = fname;
						}
						break;
					default:
						RS.Logger.Warn("Act: bad code {}.", *str);
						i = " <@@@> ";
						break;
				}
			}

			++str;

			while ((*point = *i) != '\0')
			{
				++point, ++i;
			}
		}

		*point++ = '\n';
		*point++ = '\r';
		*point = '\0';

		if (!str_prefix("\x01B[0m", buf))
			buf[4] = UPPER(buf[4]);
		else if (!str_prefix("\x01B", buf))
			buf[7] = UPPER(buf[7]);
		else
			buf[0] = UPPER(buf[0]);

		if (to->desc != nullptr)
			write_to_buffer(to->desc, buf, point - buf);
	}
}